

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

int mbedtls_md_setup(mbedtls_md_context_t *ctx,mbedtls_md_info_t *md_info,int hmac)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  
  iVar3 = -0x5100;
  if (ctx != (mbedtls_md_context_t *)0x0 && md_info != (mbedtls_md_info_t *)0x0) {
    pvVar1 = (*md_info->ctx_alloc_func)();
    ctx->md_ctx = pvVar1;
    iVar3 = -0x5180;
    if (pvVar1 != (void *)0x0) {
      if (hmac != 0) {
        pvVar2 = calloc(2,(long)md_info->block_size);
        ctx->hmac_ctx = pvVar2;
        if (pvVar2 == (void *)0x0) {
          (*md_info->ctx_free_func)(pvVar1);
          return -0x5180;
        }
      }
      ctx->md_info = md_info;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_md_setup( mbedtls_md_context_t *ctx, const mbedtls_md_info_t *md_info, int hmac )
{
    if( md_info == NULL || ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( ctx->md_ctx = md_info->ctx_alloc_func() ) == NULL )
        return( MBEDTLS_ERR_MD_ALLOC_FAILED );

    if( hmac != 0 )
    {
        ctx->hmac_ctx = mbedtls_calloc( 2, md_info->block_size );
        if( ctx->hmac_ctx == NULL )
        {
            md_info->ctx_free_func( ctx->md_ctx );
            return( MBEDTLS_ERR_MD_ALLOC_FAILED );
        }
    }

    ctx->md_info = md_info;

    return( 0 );
}